

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::~Server(Server *this)

{
  Server *this_local;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_001fa820;
  *(undefined **)&this->super_Rehashable = &DAT_001fa858;
  if (GameCommand::selected_server == (Server *)0x0) {
    GameCommand::selected_server = (Server *)0x0;
  }
  if (GameCommand::active_server == (Server *)0x0) {
    GameCommand::active_server = GameCommand::selected_server;
  }
  Jupiter::Socket::close();
  wipeData(this);
  std::__cxx11::string::~string((string *)&this->m_CommandPrefix);
  std::__cxx11::string::~string((string *)&this->m_IRCPrefix);
  std::__cxx11::string::~string((string *)&this->m_ban_from_str);
  std::__cxx11::string::~string((string *)&this->m_rules);
  std::__cxx11::string::~string((string *)&this->m_configSection);
  std::__cxx11::string::~string((string *)&this->m_pass);
  std::__cxx11::string::~string((string *)&this->m_hostname);
  std::__cxx11::string::~string((string *)&this->m_clientHostname);
  std::
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ::~vector(&this->m_commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_commandListFormat);
  Jupiter::TCPSocket::~TCPSocket(&this->m_sock);
  Map::~Map(&this->m_map);
  std::__cxx11::string::~string((string *)&this->m_lastCommandParams);
  std::__cxx11::string::~string((string *)&this->m_lastCommand);
  std::__cxx11::string::~string((string *)&this->m_serverName);
  std::__cxx11::string::~string((string *)&this->m_gameVersion);
  std::__cxx11::string::~string((string *)&this->m_rconUser);
  std::__cxx11::string::~string((string *)&this->m_lastLine);
  Jupiter::Config::~Config(&this->varData);
  std::vector<RenX::Map,_std::allocator<RenX::Map>_>::~vector(&this->maps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->mutators);
  std::
  vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  ::~vector(&this->buildings);
  std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::~list(&this->players);
  Jupiter::Rehashable::~Rehashable(&this->super_Rehashable);
  Jupiter::Thinker::~Thinker(&this->super_Thinker);
  return;
}

Assistant:

RenX::Server::~Server() {
	// TODO: This does nothing
	if (RenX::GameCommand::selected_server == nullptr)
		RenX::GameCommand::selected_server = nullptr;
	if (RenX::GameCommand::active_server == nullptr)
		RenX::GameCommand::active_server = RenX::GameCommand::selected_server;

	m_sock.close();
	wipeData();
}